

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridLocalPolynomial.hpp
# Opt level: O3

void __thiscall
TasGrid::GridLocalPolynomial::walkTree<2,(TasGrid::RuleLocal::erule)1>
          (GridLocalPolynomial *this,MultiIndexSet *work,double *x,
          vector<int,_std::allocator<int>_> *sindx,vector<double,_std::allocator<double>_> *svals,
          double *y)

{
  iterator iVar1;
  iterator iVar2;
  long lVar3;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __first;
  void *pvVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  vector<double,std::allocator<double>> *__x;
  pointer piVar8;
  ulong uVar9;
  int *piVar10;
  pointer piVar11;
  pointer piVar12;
  ulong uVar13;
  double *pdVar14;
  int *r;
  int iVar15;
  int *piVar16;
  undefined1 auVar17 [16];
  int iVar18;
  int iVar21;
  undefined1 auVar20 [16];
  bool isSupported;
  double basis_value;
  int p;
  vector<int,_std::allocator<int>_> monkey_tail;
  vector<int,_std::allocator<int>_> monkey_count;
  vector<int,_std::allocator<int>_> idx;
  vector<double,_std::allocator<double>_> basis_derivative;
  vector<double,_std::allocator<double>_> vls;
  bool local_d9;
  double local_d8;
  vector<int,_std::allocator<int>_> local_d0;
  vector<double,std::allocator<double>> *local_b8;
  vector<int,_std::allocator<int>_> local_b0;
  vector<int,_std::allocator<int>_> local_98;
  int *local_80;
  vector<int,_std::allocator<int>_> local_78;
  vector<double,_std::allocator<double>_> local_60;
  vector<double,_std::allocator<double>_> local_48;
  undefined1 auVar19 [16];
  
  ::std::vector<int,_std::allocator<int>_>::vector
            (&local_98,(long)this->top_level + 1,(allocator_type *)&local_b0);
  ::std::vector<int,_std::allocator<int>_>::vector
            (&local_b0,(long)this->top_level + 1,(allocator_type *)&local_60);
  local_b8 = (vector<double,std::allocator<double>> *)svals;
  ::std::vector<double,_std::allocator<double>_>::vector
            (&local_60,(long)(this->super_BaseCanonicalGrid).num_dimensions,
             (allocator_type *)&local_d0);
  piVar10 = (this->roots).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_80 = (this->roots).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
  if (piVar10 != local_80) {
    do {
      local_d8 = evalBasisSupported<(TasGrid::RuleLocal::erule)1>
                           (this,(work->indexes).super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_start +
                                 (long)*piVar10 * work->num_dimensions,x,&local_d9);
      if (local_d9 == true) {
        iVar1._M_current =
             (sindx->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_finish;
        if (iVar1._M_current ==
            (sindx->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
          ::std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)sindx,iVar1,piVar10);
        }
        else {
          *iVar1._M_current = *piVar10;
          (sindx->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_finish = iVar1._M_current + 1;
        }
        iVar2._M_current = *(double **)(local_b8 + 8);
        if (iVar2._M_current == *(double **)(local_b8 + 0x10)) {
          ::std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                    (local_b8,iVar2,&local_d8);
        }
        else {
          *iVar2._M_current = local_d8;
          *(double **)(local_b8 + 8) = iVar2._M_current + 1;
        }
        iVar15 = *piVar10;
        *local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start = iVar15;
        piVar11 = (this->pntr).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        iVar15 = piVar11[iVar15];
        *local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start = iVar15;
        if (iVar15 < piVar11[(long)*local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start + 1]) {
          iVar15 = 0;
          piVar8 = local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          piVar12 = local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          do {
            if (piVar12[iVar15] < piVar11[(long)piVar8[iVar15] + 1]) {
              local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start._0_4_ =
                   (this->indx).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[piVar12[iVar15]];
              local_d8 = evalBasisSupported<(TasGrid::RuleLocal::erule)1>
                                   (this,(work->indexes).
                                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                         super__Vector_impl_data._M_start +
                                         (long)(int)local_d0.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start *
                                         work->num_dimensions,x,&local_d9);
              if (local_d9 == true) {
                iVar1._M_current =
                     (sindx->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_finish;
                if (iVar1._M_current ==
                    (sindx->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  ::std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                            ((vector<int,std::allocator<int>> *)sindx,iVar1,(int *)&local_d0);
                }
                else {
                  *iVar1._M_current =
                       (int)local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start;
                  (sindx->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_finish = iVar1._M_current + 1;
                }
                iVar2._M_current = *(double **)(local_b8 + 8);
                if (iVar2._M_current == *(double **)(local_b8 + 0x10)) {
                  ::std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                            (local_b8,iVar2,&local_d8);
                }
                else {
                  *iVar2._M_current = local_d8;
                  *(double **)(local_b8 + 8) = iVar2._M_current + 1;
                }
                local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[(long)iVar15 + 1] =
                     (int)local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start;
                piVar11 = (this->pntr).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start;
                local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[(long)iVar15 + 1] =
                     piVar11[(int)local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start];
                piVar8 = local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start;
                piVar12 = local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start;
                iVar15 = iVar15 + 1;
              }
              else {
                local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[iVar15] =
                     local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[iVar15] + 1;
                piVar11 = (this->pntr).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start;
                piVar8 = local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start;
                piVar12 = local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start;
              }
            }
            else {
              piVar12[(long)iVar15 + -1] = piVar12[(long)iVar15 + -1] + 1;
              iVar15 = iVar15 + -1;
            }
          } while (*piVar12 < piVar11[(long)*piVar8 + 1]);
        }
      }
      piVar10 = piVar10 + 1;
    } while (piVar10 != local_80);
  }
  ::std::vector<int,_std::allocator<int>_>::vector
            (&local_d0,(vector<int,_std::allocator<int>_> *)sindx);
  __x = local_b8;
  piVar8 = local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  auVar7 = _DAT_001ca0b0;
  auVar6 = _DAT_001ca070;
  auVar5 = _DAT_001ca060;
  __first._M_current._4_4_ =
       local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start._4_4_;
  __first._M_current._0_4_ =
       (int)local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start;
  if (__first._M_current !=
      local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    uVar9 = ((long)local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)__first._M_current) - 4;
    auVar20._8_4_ = (int)uVar9;
    auVar20._0_8_ = uVar9;
    auVar20._12_4_ = (int)(uVar9 >> 0x20);
    auVar17._0_8_ = uVar9 >> 2;
    auVar17._8_8_ = auVar20._8_8_ >> 2;
    uVar13 = 0;
    auVar17 = auVar17 ^ _DAT_001ca060;
    do {
      iVar18 = (int)uVar13;
      auVar19._8_4_ = iVar18;
      auVar19._0_8_ = uVar13;
      auVar19._12_4_ = (int)(uVar13 >> 0x20);
      auVar20 = (auVar19 | auVar6) ^ auVar5;
      iVar15 = auVar17._4_4_;
      if ((bool)(~(auVar20._4_4_ == iVar15 && auVar17._0_4_ < auVar20._0_4_ ||
                  iVar15 < auVar20._4_4_) & 1)) {
        __first._M_current[uVar13] = iVar18;
      }
      if ((auVar20._12_4_ != auVar17._12_4_ || auVar20._8_4_ <= auVar17._8_4_) &&
          auVar20._12_4_ <= auVar17._12_4_) {
        __first._M_current[uVar13 + 1] = iVar18 + 1;
      }
      auVar20 = (auVar19 | auVar7) ^ auVar5;
      iVar21 = auVar20._4_4_;
      if (iVar21 <= iVar15 && (iVar21 != iVar15 || auVar20._0_4_ <= auVar17._0_4_)) {
        __first._M_current[uVar13 + 2] = iVar18 + 2;
        __first._M_current[uVar13 + 3] = iVar18 + 3;
      }
      uVar13 = uVar13 + 4;
    } while (((uVar9 >> 2) + 4 & 0xfffffffffffffffc) != uVar13);
    uVar9 = (long)local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)__first._M_current >> 2;
    lVar3 = 0x3f;
    if (uVar9 != 0) {
      for (; uVar9 >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    ::std::
    __introsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<TasGrid::GridLocalPolynomial::walkTree<2,(TasGrid::RuleLocal::erule)1>(TasGrid::MultiIndexSet_const&,double_const*,std::vector<int,std::allocator<int>>&,std::vector<double,std::allocator<double>>&,double*)const::_lambda(int,int)_1_>>
              (__first,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                       local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish,(ulong)(((uint)lVar3 ^ 0x3f) * 2) ^ 0x7e,
               (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_mkstoyanov[P]TASMANIAN_SparseGrids_tsgGridLocalPolynomial_hpp:318:47)>
                )sindx);
    ::std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<TasGrid::GridLocalPolynomial::walkTree<2,(TasGrid::RuleLocal::erule)1>(TasGrid::MultiIndexSet_const&,double_const*,std::vector<int,std::allocator<int>>&,std::vector<double,std::allocator<double>>&,double*)const::_lambda(int,int)_1_>>
              (__first,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)piVar8,
               (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_mkstoyanov[P]TASMANIAN_SparseGrids_tsgGridLocalPolynomial_hpp:318:47)>
                )sindx);
  }
  ::std::vector<int,_std::allocator<int>_>::vector
            (&local_78,(vector<int,_std::allocator<int>_> *)sindx);
  ::std::vector<double,_std::allocator<double>_>::vector
            (&local_48,(vector<double,_std::allocator<double>_> *)__x);
  piVar10 = (int *)CONCAT44(local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start._4_4_,
                            (int)local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start);
  if (piVar10 !=
      local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    piVar11 = (sindx->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
              ._M_start;
    piVar16 = piVar10;
    do {
      *piVar11 = local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[*piVar16];
      piVar16 = piVar16 + 1;
      piVar11 = piVar11 + 1;
    } while (piVar16 !=
             local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish);
    pdVar14 = *(double **)__x;
    do {
      *pdVar14 = local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[*piVar10];
      piVar10 = piVar10 + 1;
      pdVar14 = pdVar14 + 1;
    } while (piVar10 !=
             local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish);
  }
  if (local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  pvVar4 = (void *)CONCAT44(local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start._4_4_,
                            (int)local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start);
  if (pvVar4 != (void *)0x0) {
    operator_delete(pvVar4,(long)local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pvVar4);
  }
  if (local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void walkTree(const MultiIndexSet &work, const double x[], std::vector<int> &sindx, std::vector<double> &svals, double *y) const{
        std::vector<int> monkey_count(top_level+1); // traverse the tree, counts the branches of the current node
        std::vector<int> monkey_tail(top_level+1); // traverse the tree, keeps track of the previous node (history)

        bool isSupported;
        double basis_value;
        std::vector<double> basis_derivative(num_dimensions);

        for(const auto &r : roots){
            if (mode == 3 or mode == 4) {
                diffBasisSupported<effrule>(work.getIndex(r), x, basis_derivative.data(), isSupported);
            } else {
                basis_value = evalBasisSupported<effrule>(work.getIndex(r), x, isSupported);
            }

            if (isSupported){
                if (mode == 0){
                    double const *s = surpluses.getStrip(r);
                    for(int k=0; k<num_outputs; k++)
                        y[k] += basis_value * s[k];
                }else if (mode == 1 or mode == 2){
                    sindx.push_back(r);
                    svals.push_back(basis_value);
                }else if (mode == 3){
                    double const *s = surpluses.getStrip(r);
                    for(int k=0; k<num_outputs; k++)
                        for (int d=0; d<num_dimensions; d++)
                            y[k * num_dimensions + d] += basis_derivative[d] * s[k];
                }else{
                    sindx.push_back(r);
                    for (auto dx : basis_derivative)
                        svals.push_back(dx);
                }

                int current = 0;
                monkey_tail[0] = r;
                monkey_count[0] = pntr[r];

                while(monkey_count[0] < pntr[monkey_tail[0]+1]){
                    if (monkey_count[current] < pntr[monkey_tail[current]+1]){
                        int p = indx[monkey_count[current]];
                        if (mode == 3 or mode == 4){
                            diffBasisSupported<effrule>(work.getIndex(p), x, basis_derivative.data(), isSupported);
                        }else{
                            basis_value = evalBasisSupported<effrule>(work.getIndex(p), x, isSupported);
                        }
                        if (isSupported){
                            if (mode == 0){
                                double const *s = surpluses.getStrip(p);
                                for(int k=0; k<num_outputs; k++)
                                    y[k] += basis_value * s[k];
                            }else if (mode == 1 or mode == 2){
                                sindx.push_back(p);
                                svals.push_back(basis_value);
                            }else if (mode == 3){
                                double const *s = surpluses.getStrip(p);
                                for(int k=0; k<num_outputs; k++)
                                    for (int d=0; d<num_dimensions; d++)
                                        y[k * num_dimensions + d] += basis_derivative[d] * s[k];
                            }else{
                                sindx.push_back(p);
                                for (auto dx : basis_derivative)
                                    svals.push_back(dx);
                            }
                            monkey_tail[++current] = p;
                            monkey_count[current] = pntr[p];
                        }else{
                            monkey_count[current]++;
                        }
                    }else{
                        monkey_count[--current]++;
                    }
                }
            }
        }

        // according to https://docs.nvidia.com/cuda/cusparse/index.html#sparse-format
        // "... it is assumed that the indices are provided in increasing order and that each index appears only once."
        // This may not be a requirement for cusparseDgemvi(), but it may be that I have not tested it sufficiently
        // Also, see AccelerationDataGPUFull::cusparseMatveci() for inaccuracies in Nvidia documentation
        if (mode == 2){
            std::vector<int> map(sindx);
            std::iota(map.begin(), map.end(), 0);
            std::sort(map.begin(), map.end(), [&](int a, int b)->bool{ return (sindx[a] < sindx[b]); });

            std::vector<int> idx = sindx;
            std::vector<double> vls = svals;
            std::transform(map.begin(), map.end(), sindx.begin(), [&](int i)->int{ return idx[i]; });
            std::transform(map.begin(), map.end(), svals.begin(), [&](int i)->double{ return vls[i]; });
        }
    }